

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::binding_array_implicit
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  ShaderProgram *pSVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint *puVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LayoutBindingProgram *this_00;
  Shader *pSVar8;
  mapped_type_conflict *pmVar9;
  undefined1 uVar10;
  uint uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  bool *pbVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  int expected;
  bool bVar17;
  String local_4d0;
  String local_4b0;
  ulong local_490;
  LayoutBindingProgram *local_488;
  allocator<char> local_47a;
  allocator<char> local_479;
  ulong local_478;
  LayoutBindingTestResult *local_470;
  StringVector list;
  long *local_430 [2];
  long local_420 [2];
  IProgramContextSupplier *local_410;
  code *local_408;
  uint *local_400;
  ulong local_3f8;
  String local_3f0;
  long *local_3d0 [2];
  long local_3c0 [2];
  String local_3b0;
  String decl;
  vector<int,_std::allocator<int>_> bindings;
  String local_358;
  StringIntMap bindingPoints;
  ios_base local_2c8 [264];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  StringStream s;
  undefined4 extraout_var_01;
  
  iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])(this);
  makeSparseRange(&bindings,this,iVar5,0);
  uVar10 = true;
  local_470 = __return_storage_ptr__;
  if (bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start <
      bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_410 = &this->super_IProgramContextSupplier;
    local_408 = glUniformMatrix3x2fv;
    paVar1 = &(__return_storage_ptr__->m_reason).field_2;
    local_490 = CONCAT44(local_490._4_4_,(int)CONCAT71((int7)((ulong)paVar1 >> 8),1));
    puVar7 = (uint *)bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    do {
      paVar12 = &local_4b0.field_2;
      uVar14 = *puVar7;
      local_400 = puVar7;
      iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x20])(this);
      uVar6 = iVar5 - uVar14;
      local_478 = CONCAT44(local_478._4_4_,uVar6);
      uVar15 = 4;
      if ((int)uVar6 < 4) {
        uVar15 = (ulong)uVar6;
      }
      iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&s,*(char **)CONCAT44(extraout_var,iVar5),&local_479);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1a])
                ((String *)&bindingPoints,this,(ulong)uVar14);
      iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
      local_3f8 = (ulong)uVar14;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4b0,*(char **)(CONCAT44(extraout_var_00,iVar5) + 0x18),&local_47a)
      ;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(&list,this,0);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
                (&local_4d0,this,&list);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_3d0,this,0)
      ;
      local_430[0] = local_420;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_430,"float","");
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1d])
                (&local_3b0,this,local_3d0,(string *)local_430);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                (&local_3f0,this,0);
      uVar14 = (uint)uVar15;
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1e])
                (&local_358,this,uVar15);
      buildUniformDecl(&decl,this,(String *)&s,(String *)&bindingPoints,&local_4b0,&local_4d0,
                       &local_3b0,&local_3f0,&local_358);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != &local_358.field_2) {
        operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
        operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
      if (local_430[0] != local_420) {
        operator_delete(local_430[0],local_420[0] + 1);
      }
      if (local_3d0[0] != local_3c0) {
        operator_delete(local_3d0[0],local_3c0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
      }
      if (list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(list.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((list.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b0._M_dataplus._M_p != paVar12) {
        operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
      }
      if ((_Base_ptr *)bindingPoints._M_t._M_impl._0_8_ !=
          &bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)bindingPoints._M_t._M_impl._0_8_,
                        (ulong)((long)&(bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
          _vptr_basic_ostream !=
          (_func_int **)
          &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        CONCAT71(s.super_ostringstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                                 s.super_ostringstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
      }
      setTemplateParam(this,(this->m_stage).type,"UNIFORM_DECL",&decl);
      std::ios_base::ios_base
                ((ios_base *)
                 &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                  field_0x70);
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ = local_408;
      s.super_ostringstream._328_8_ = 0;
      s.super_ostringstream._336_2_ = 0;
      s.super_ostringstream._360_8_ = 0;
      s.super_ostringstream._368_8_ = 0;
      s.super_ostringstream._344_8_ = 0;
      s.super_ostringstream._352_8_ = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)&PTR__StringStream_020fda68;
      s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._112_8_ =
           &PTR__StringStream_020fda90;
      if (0 < (int)local_478) {
        uVar6 = 1;
        if (1 < (int)uVar14) {
          uVar6 = uVar14;
        }
        uVar16 = 0;
        do {
          iVar5 = (int)uVar16;
          pbVar13 = (bool *)0x1be7f65;
          if (iVar5 == 0) {
            pbVar13 = fixed_sample_locations_values + 1;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&s,pbVar13,(ulong)(iVar5 != 0) * 3);
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1f])
                    (&local_4b0,this,0,uVar16);
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1b])
                    (&bindingPoints,this,&local_4b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&s,(char *)bindingPoints._M_t._M_impl._0_8_,
                     bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
          if ((_Base_ptr *)bindingPoints._M_t._M_impl._0_8_ !=
              &bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
            operator_delete((void *)bindingPoints._M_t._M_impl._0_8_,
                            (ulong)((long)&(bindingPoints._M_t._M_impl.super__Rb_tree_header.
                                            _M_header._M_parent)->_M_color + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4b0._M_dataplus._M_p != paVar12) {
            operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
          }
          uVar16 = (ulong)(iVar5 + 1U);
        } while (uVar6 != iVar5 + 1U);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&s,";\n",2);
      std::__cxx11::stringbuf::str();
      setTemplateParam(this,(this->m_stage).type,"UNIFORM_ACCESS",(String *)&bindingPoints);
      if ((_Base_ptr *)bindingPoints._M_t._M_impl._0_8_ !=
          &bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)bindingPoints._M_t._M_impl._0_8_,
                        (ulong)((long)&(bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      updateTemplate(this,(this->m_stage).type);
      iVar5 = (*local_410->_vptr_IProgramContextSupplier[6])();
      this_00 = (LayoutBindingProgram *)CONCAT44(extraout_var_01,iVar5);
      iVar5 = (*this_00->_vptr_LayoutBindingProgram[2])(this_00);
      pSVar3 = this_00->m_program;
      local_488 = this_00;
      if (iVar5 == 2) {
        pSVar8 = *pSVar3->m_shaders[5].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((pSVar8->m_info).compileOk != true) goto LAB_00bcee69;
LAB_00bcebe8:
        bVar4 = (char)local_490 != '\0' & (pSVar3->m_program).m_info.linkOk;
        local_490 = CONCAT44(local_490._4_4_,(int)CONCAT71((int7)((ulong)pSVar8 >> 8),bVar4));
        if (bVar4 == 0) goto LAB_00bcee69;
        list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (0 < (int)local_478) {
          uVar6 = 1;
          if (1 < (int)uVar14) {
            uVar6 = uVar14;
          }
          uVar16 = 0;
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&bindingPoints);
            (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                      (&local_4b0,this,0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&bindingPoints,local_4b0._M_dataplus._M_p,
                       local_4b0._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4b0._M_dataplus._M_p != paVar12) {
              operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1
                             );
            }
            (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
                      (&local_4d0,this,0);
            (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
                      (&local_4b0,this,&local_4d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
              operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_4b0._M_string_length != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&bindingPoints,"_block",6);
            }
            (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1e])
                      (&local_4d0,this,uVar16);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&bindingPoints,local_4d0._M_dataplus._M_p,
                       local_4d0._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
              operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::stringbuf::str();
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&list,
                       &local_4d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
              operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4b0._M_dataplus._M_p != paVar12) {
              operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&bindingPoints);
            std::ios_base::~ios_base(local_2c8);
            uVar11 = (int)uVar16 + 1;
            uVar16 = (ulong)uVar11;
          } while (uVar6 != uVar11);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_1c0,&list);
        (*local_488->_vptr_LayoutBindingProgram[3])(&bindingPoints,local_488,&local_1c0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1c0);
        if ((int)local_478 < 1) {
          bVar17 = true;
        }
        else {
          local_478 = uVar15;
          if ((int)uVar14 < 2) {
            local_478 = 1;
          }
          uVar16 = 0;
          bVar17 = false;
          iVar5 = 0;
          local_490 = uVar15;
          do {
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[](&bindingPoints,
                                  list.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar16);
            expected = (int)local_3f8 + iVar5;
            if (expected != *pmVar9) {
              local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_4d0,"binding point did not match default","");
              pmVar9 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::operator[](&bindingPoints,
                                    list.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar16);
              generateLog<int,int>(&local_4b0,this,&local_4d0,*pmVar9,expected);
              local_470->m_passed = false;
              local_470->m_notRunForThisContext = false;
              (local_470->m_reason)._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&__return_storage_ptr__->m_reason,local_4b0._M_dataplus._M_p,
                         local_4b0._M_dataplus._M_p + local_4b0._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
                operator_delete(local_4b0._M_dataplus._M_p,
                                local_4b0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
                operator_delete(local_4d0._M_dataplus._M_p,
                                local_4d0.field_2._M_allocated_capacity + 1);
              }
              local_490 = local_490 & 0xffffffff00000000;
              goto LAB_00bcefaf;
            }
            uVar16 = uVar16 + 1;
            iVar5 = iVar5 + 1;
            bVar17 = local_490 <= uVar16;
          } while (uVar16 != local_478);
          local_490 = CONCAT44(local_490._4_4_,(int)CONCAT71((int7)((ulong)pmVar9 >> 8),1));
        }
LAB_00bcefaf:
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::~_Rb_tree(&bindingPoints._M_t);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&list);
      }
      else {
        pSVar8 = *pSVar3->m_shaders[1].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((pSVar8->m_info).compileOk != false) goto LAB_00bcebe8;
LAB_00bcee69:
        LayoutBindingProgram::getErrorLog_abi_cxx11_((String *)&bindingPoints,this_00,false);
        local_470->m_passed = false;
        local_470->m_notRunForThisContext = false;
        (local_470->m_reason)._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_reason,bindingPoints._M_t._M_impl._0_8_,
                   bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ +
                   bindingPoints._M_t._M_impl._0_8_);
        if ((_Base_ptr *)bindingPoints._M_t._M_impl._0_8_ !=
            &bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)bindingPoints._M_t._M_impl._0_8_,
                          (ulong)((long)&(bindingPoints._M_t._M_impl.super__Rb_tree_header._M_header
                                         ._M_parent)->_M_color + 1));
        }
        bVar17 = false;
        local_490 = local_490 & 0xffffffff00000000;
      }
      (*local_488->_vptr_LayoutBindingProgram[1])();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base
                ((ios_base *)
                 &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                  field_0x70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)decl._M_dataplus._M_p != &decl.field_2) {
        operator_delete(decl._M_dataplus._M_p,decl.field_2._M_allocated_capacity + 1);
      }
      if (!bVar17) goto LAB_00bcf0a0;
      puVar7 = local_400 + 1;
    } while (puVar7 < bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
    uVar10 = (undefined1)local_490;
  }
  puVar2 = &s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._16_1_ = 0;
  local_470->m_passed = (bool)uVar10;
  local_470->m_notRunForThisContext = false;
  (local_470->m_reason)._M_dataplus._M_p = (pointer)&(local_470->m_reason).field_2;
  s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)puVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_470->m_reason,puVar2,puVar2);
  if (s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
      != (_func_int **)puVar2) {
    operator_delete(s.super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    CONCAT71(s.super_ostringstream.
                             super_basic_ostream<char,_std::char_traits<char>_>._17_7_,
                             s.super_ostringstream.
                             super_basic_ostream<char,_std::char_traits<char>_>._16_1_) + 1);
  }
LAB_00bcf0a0:
  if (bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)bindings.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_470;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::binding_array_implicit(void)
{
	bool passed = true;

	std::vector<int> bindings = makeSparseRange(maxBindings(), 0);
	for (std::vector<int>::iterator it = bindings.begin(); it < bindings.end(); it++)
	{
		int baseBindingPoint = *it;
		int arraySize		 = std::min(maxBindings() - baseBindingPoint, 4);

		String decl =
			buildUniformDecl(String(getTestParameters().keyword), buildLayout(baseBindingPoint),
							 String(getTestParameters().uniform_type), buildBlockName(getDefaultUniformName()),
							 buildBlock(getDefaultUniformName()), getDefaultUniformName(), buildArray(arraySize));
		setTemplateParam("UNIFORM_DECL", decl);

		StringStream s;
		for (int idx = 0; idx < arraySize; idx++)
		{
			s << (idx ? " + " : "") << buildAccess(buildArrayAccess(0, idx));
		}
		s << ";\n";
		setTemplateParam("UNIFORM_ACCESS", s.str());
		updateTemplate();

		LayoutBindingProgram::LayoutBindingProgramAutoPtr program(*this);
		passed &= program->compiledAndLinked();
		if (!passed)
		{
			return LayoutBindingTestResult(passed, program->getErrorLog());
		}
		StringVector list;
		for (int idx = 0; idx < arraySize; idx++)
		{
			std::ostringstream texUnitStr;
			texUnitStr << getDefaultUniformName();
			const String& u = buildBlockName(getDefaultUniformName());
			if (!u.empty())
				texUnitStr << "_block";
			texUnitStr << buildArray(idx);
			list.push_back(texUnitStr.str());
		}

		StringIntMap bindingPoints = program->getBindingPoints(list);
		for (int idx = 0; idx < arraySize; idx++)
		{
			passed &= ((baseBindingPoint + idx) == bindingPoints[list[idx]]);
			if (!passed)
			{
				return LayoutBindingTestResult(passed, generateLog(String("binding point did not match default"),
																   bindingPoints[list[idx]], (baseBindingPoint + idx)));
			}
		}
	}
	return LayoutBindingTestResult(passed, String());
}